

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O3

size_t __thiscall Js::Utf8SourceInfo::GetCbLength(Utf8SourceInfo *this,char16 *reason)

{
  ISourceHolder *pIVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  char16_t *pcVar6;
  
  if ((this->sourceHolder).ptr == (ISourceHolder *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x4e,"(this->sourceHolder != nullptr)","We have no source mapper.")
    ;
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if ((byte)((this->field_0xa8 & 0x40) >> 6 &
            ((byte)this->field_0xa8 >> 5 | (this->debugModeSource).ptr != (uchar *)0x0)) == 1) {
    return this->debugModeSourceLength;
  }
  pIVar1 = (this->sourceHolder).ptr;
  pcVar6 = L"Utf8SourceInfo::GetSource";
  if (reason != (char16 *)0x0) {
    pcVar6 = reason;
  }
  iVar4 = (*(pIVar1->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])(pIVar1,pcVar6);
  return CONCAT44(extraout_var,iVar4);
}

Assistant:

size_t Utf8SourceInfo::GetCbLength(const char16 * reason) const
    {
        AssertMsg(this->sourceHolder != nullptr, "We have no source mapper.");
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            AssertMsg(this->debugModeSource != nullptr || this->debugModeSourceIsEmpty, "Debug mode source should have been set by this point.");
            return debugModeSourceLength;
        }
        else
#endif
        {
            return sourceHolder->GetByteLength(reason == nullptr ? _u("Utf8SourceInfo::GetSource") : reason);
        }
    }